

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::DeleteRemainingArguments
          (CommandLineArguments *this,int argc,char ***argv)

{
  char **ppcVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar2 = uVar3;
  }
  for (; ppcVar1 = *argv, uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (ppcVar1[uVar3] != (char *)0x0) {
      operator_delete__(ppcVar1[uVar3]);
    }
  }
  if (ppcVar1 != (char **)0x0) {
    operator_delete__(ppcVar1);
    return;
  }
  return;
}

Assistant:

void CommandLineArguments::DeleteRemainingArguments(int argc, char*** argv)
{
  int cc;
  for ( cc = 0; cc < argc; ++ cc )
    {
    delete [] (*argv)[cc];
    }
  delete [] *argv;
}